

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O0

void __thiscall
xray_re::xr_sound_env_object::xr_sound_env_object(xr_sound_env_object *this,xr_scene *scene)

{
  xr_scene *scene_local;
  xr_sound_env_object *this_local;
  
  xr_shape_object::xr_shape_object(&this->super_xr_shape_object,scene,TOOLS_CLASS_SOUND_ENV);
  (this->super_xr_shape_object).super_xr_custom_object._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_sound_env_object_0038de88;
  std::__cxx11::string::string((string *)&this->m_inner);
  std::__cxx11::string::string((string *)&this->m_outer);
  return;
}

Assistant:

xr_sound_env_object::xr_sound_env_object(xr_scene& scene):
	xr_shape_object(scene, TOOLS_CLASS_SOUND_ENV) {}